

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree_test.cpp
# Opt level: O0

pboolean tree_traverse(ppointer key,ppointer value,ppointer data)

{
  int iVar1;
  TreeData *tdata;
  ppointer data_local;
  ppointer value_local;
  ppointer key_local;
  
  iVar1 = (int)key;
  *(int *)((long)data + 0x14) = iVar1 + *(int *)((long)data + 0x14);
  *(int *)((long)data + 0x18) = (int)value + *(int *)((long)data + 0x18);
  *(int *)((long)data + 0xc) = *(int *)((long)data + 0xc) + 1;
  if (iVar1 <= *(int *)((long)data + 0x1c)) {
    *(int *)((long)data + 0x20) = *(int *)((long)data + 0x20) + 1;
  }
  *(int *)((long)data + 0x1c) = iVar1;
  return 0;
}

Assistant:

static pboolean
tree_traverse (ppointer key, ppointer value, ppointer data)
{
	TreeData *tdata = ((TreeData *) data);

	tdata->key_sum	 += PPOINTER_TO_INT (key);
	tdata->value_sum += PPOINTER_TO_INT (value);
	tdata->traverse_counter++;

	if (tdata->last_key >= PPOINTER_TO_INT (key))
		tdata->key_order_errors++;

	tdata->last_key = PPOINTER_TO_INT (key);

	return FALSE;
}